

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O3

void __thiscall
CheckedTimedMutexTest_RecurseTryLockFor_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedTimedMutexTest_RecurseTryLockFor_Test<yamc::checked::timed_mutex> *this)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  StringLike<const_char_*> *regex;
  element_type *peVar5;
  DeathTest *gtest_dt;
  TypeParam mtx;
  element_type *local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [24];
  AssertHelper local_c8 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a8;
  mutex_base local_90;
  
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)&local_90);
  local_e0._0_8_ = (char *)0x0;
  local_e0._8_8_ = 0;
  local_f0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0._0_8_ = (element_type *)local_e0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    yamc::checked::detail::mutex_base::lock(&local_90);
  }
  if ((element_type *)local_f0._0_8_ != (element_type *)local_e0) {
    operator_delete((void *)local_f0._0_8_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_c8[0].data_ = (AssertHelperData *)0x1cec69;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_f0,
               (testing *)local_c8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a8,(PolymorphicMatcher *)local_f0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("mtx.try_lock_for(std::chrono::seconds(1))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0xe9,(DeathTest **)&local_f8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a8);
    peVar5 = local_f8;
    if (!bVar2) goto LAB_001853f4;
    if (local_f8 == (element_type *)0x0) goto LAB_0018544a;
    iVar3 = (**(code **)(local_f8->pattern_ + 0x10))(local_f8);
    peVar1 = local_f8;
    if (iVar3 == 0) {
      testing::KilledBySignal::KilledBySignal((KilledBySignal *)local_f0,6);
      iVar3 = (**(code **)(local_f8->pattern_ + 0x18))();
      bVar2 = testing::KilledBySignal::operator()((KilledBySignal *)local_f0,iVar3);
      iVar3 = (**(code **)(peVar1->pattern_ + 0x20))(peVar1,(ulong)bVar2);
      if ((char)iVar3 == '\0') {
        (**(code **)(peVar5->pattern_ + 8))(peVar5);
        goto LAB_001853f4;
      }
    }
    else if (iVar3 == 1) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        local_f0._0_8_ = (element_type *)0x1;
        yamc::checked::timed_mutex::try_lock_for<long,std::ratio<1l,1l>>
                  ((timed_mutex *)&local_90,(duration<long,_std::ratio<1L,_1L>_> *)local_f0);
      }
      (**(code **)(local_f8->pattern_ + 0x28))(local_f8,2);
      (**(code **)(peVar1->pattern_ + 0x28))(peVar1,0);
    }
    pcVar4 = peVar5->pattern_;
  }
  else {
LAB_001853f4:
    testing::Message::Message((Message *)local_f0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xe9,pcVar4);
    testing::internal::AssertHelper::operator=(local_c8,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    if ((element_type *)local_f0._0_8_ == (element_type *)0x0) goto LAB_0018544a;
    pcVar4 = *(char **)local_f0._0_8_;
    peVar5 = (element_type *)local_f0._0_8_;
  }
  (**(code **)(pcVar4 + 8))(peVar5);
LAB_0018544a:
  local_e0._0_8_ = (char *)0x0;
  local_e0._8_8_ = 0;
  local_f0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0._0_8_ = (element_type *)local_e0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    yamc::checked::detail::mutex_base::unlock(&local_90);
  }
  if ((element_type *)local_f0._0_8_ != (element_type *)local_e0) {
    operator_delete((void *)local_f0._0_8_);
  }
  yamc::checked::timed_mutex::~timed_mutex((timed_mutex *)&local_90);
  return;
}

Assistant:

TYPED_TEST(CheckedTimedMutexTest, RecurseTryLockFor) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());
  EXPECT_CHECK_FAILURE(mtx.try_lock_for(std::chrono::seconds(1)));
  ASSERT_NO_THROW(mtx.unlock());
}